

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest11InhibitPolicyMapping_::
Section11InvalidinhibitPolicyMappingTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section11InvalidinhibitPolicyMappingTest5<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.11.5";
  local_88.should_validate = false;
  PkitsTestInfo::SetUserConstrainedPolicySet(&local_88,"");
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<6ul,5ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b8020,(char *(*) [6])&PTR_anon_var_dwarf_28895f_005b8050,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest11InhibitPolicyMapping,
                     Section11InvalidinhibitPolicyMappingTest5) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitPolicyMapping5CACert",
                               "inhibitPolicyMapping5subCACert",
                               "inhibitPolicyMapping5subsubCACert",
                               "inhibitPolicyMapping5subsubsubCACert",
                               "InvalidinhibitPolicyMappingTest5EE"};
  const char* const crls[] = {
      "TrustAnchorRootCRL", "inhibitPolicyMapping5CACRL",
      "inhibitPolicyMapping5subCACRL", "inhibitPolicyMapping5subsubCACRL",
      "inhibitPolicyMapping5subsubsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.11.5";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}